

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

buffer_appender<char>
fmt::v7::detail::write<char,fmt::v7::detail::buffer_appender<char>>
          (buffer_appender<char> out,bool value)

{
  buffer_appender<char> bVar1;
  undefined8 in_RCX;
  size_t sVar2;
  char *s;
  basic_string_view<char> value_00;
  basic_string_view<char> local_38;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_28;
  undefined1 local_19;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bStack_18;
  bool value_local;
  buffer_appender<char> out_local;
  
  sVar2 = CONCAT71((int7)((ulong)in_RCX >> 8),value);
  s = "false";
  if (value) {
    s = "true";
  }
  local_28 = out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  local_19 = value;
  bStack_18 = out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  basic_string_view<char>::basic_string_view(&local_38,s);
  value_00.size_ = sVar2;
  value_00.data_ = (char *)local_38.size_;
  bVar1 = write<char>((detail *)local_28.container,(buffer_appender<char>)local_38.data_,value_00);
  return (buffer_appender<char>)
         bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write(OutputIt out, bool value) {
  return write<Char>(out, string_view(value ? "true" : "false"));
}